

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O2

string * __thiscall
XPMP2::Aircraft::SoundGetName_abi_cxx11_
          (string *__return_storage_ptr__,Aircraft *this,SoundEventsTy sndEvent,float *volAdj)

{
  char cVar1;
  uint uVar2;
  Doc8643 *pDVar3;
  byte bVar4;
  bool bVar5;
  char *__s;
  float fVar6;
  undefined8 local_48 [4];
  
  bVar4 = this->pCSLMdl->doc8643->classification[1] - 0x30;
  if (9 < bVar4) {
    bVar4 = 0;
  }
  fVar6 = (float)(int)(char)bVar4;
  *volAdj = fVar6;
  switch((ulong)sndEvent) {
  case 0:
    bVar5 = IsGroundVehicle(this);
    if (bVar5) {
LAB_002072a1:
      __s = "Electric";
    }
    else {
      pDVar3 = this->pCSLMdl->doc8643;
      if ((byte)(pDVar3->classification[0] + 0xb9U) < 2) {
        *volAdj = *volAdj + 1.0;
        __s = "PropHeli";
        break;
      }
      cVar1 = pDVar3->classification[2];
      if (cVar1 == 'T') {
        __s = "Turboprop";
        break;
      }
      if (cVar1 == 'J') {
        __s = "LoBypassJet";
        if (pDVar3->classification[1] == '1') {
          __s = "HiBypassJet";
        }
        break;
      }
      if (cVar1 != 'P') {
        if (cVar1 == 'E') goto LAB_002072a1;
        if (glob < 3) {
          uVar2 = this->modeS_id;
          (*this->_vptr_Aircraft[2])(local_48,this);
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Sound.cpp"
                 ,0x31e,"SoundGetName",logWARN,
                 "Aircraft %08X (%s): Unknown engine type \'%c\', using default engine sound",
                 (ulong)uVar2,local_48[0],
                 (ulong)(uint)(int)this->pCSLMdl->doc8643->classification[2]);
          std::__cxx11::string::~string((string *)local_48);
        }
      }
      __s = "PropAirplane";
    }
    break;
  case 1:
    __s = "ReverseThrust";
    break;
  case 2:
    *volAdj = fVar6 * 0.5;
    __s = "RollRunway";
    break;
  case 3:
    *volAdj = fVar6 * 0.25;
    __s = "Gear";
    break;
  case 4:
    *volAdj = fVar6 * 0.25;
    __s = "Flap";
    break;
  default:
    if (glob < 4) {
      uVar2 = this->modeS_id;
      (*this->_vptr_Aircraft[2])(local_48,this);
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Sound.cpp"
             ,0x32a,"SoundGetName",logERR,
             "Aircraft %08X (%s): Unknown Sound Event type %d, no sound name returned",(ulong)uVar2,
             local_48[0],(ulong)sndEvent);
      std::__cxx11::string::~string((string *)local_48);
    }
    __s = "";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string Aircraft::SoundGetName (SoundEventsTy sndEvent, float& volAdj) const
{
    // The default is: The more engines, the louder;
    // that not ownly goes for engine sounds, but also the rest will be bigger the bigger the plane
    volAdj = float(pCSLMdl->GetNumEngines());
    // Now go by event type:
    switch (sndEvent) {
        // Engine Sound is based on aircraft classification
        case SND_ENG:
            // Sanity check: need a CSL model to derive details
            if (!pCSLMdl) {
                LOG_MSG(logWARN, "Aircraft %08X (%s): No CSL model info, using default engine sound",
                        modeS_id, GetFlightId().c_str());
                return XP_SOUND_PROP_AIRPLANE;
            }
            // Now check out engine type and return proper sound name
            if (IsGroundVehicle()) {                                // We assume all ground vehicles are electric cars by now...they should be at least ;-)
                return XP_SOUND_ELECTRIC;
            }
            if (pCSLMdl->HasRotor()) {
                volAdj += 1.0f;                                     // Helis are loud anyway, but louder with more engines
                return XP_SOUND_PROP_HELI;
            }
            switch (pCSLMdl->GetClassEngType()) {
                case 'E': return XP_SOUND_ELECTRIC;
                case 'J': return pCSLMdl->GetClassNumEng() == '1' ? XP_SOUND_HIBYPASSJET : XP_SOUND_LOBYPASSJET;
                case 'P': return XP_SOUND_PROP_AIRPLANE;
                case 'T': return XP_SOUND_TURBOPROP;
                default:
                    LOG_MSG(logWARN, "Aircraft %08X (%s): Unknown engine type '%c', using default engine sound",
                            modeS_id, GetFlightId().c_str(), pCSLMdl->GetClassEngType());
                    return XP_SOUND_PROP_AIRPLANE;
            }
            
        // All other sound types have constant sounds assigned
        case SND_REVERSE_THRUST:                        return XP_SOUND_REVERSE_THRUST;
        case SND_TIRE:              volAdj *= 0.50f;    return XP_SOUND_ROLL_RUNWAY;
        case SND_GEAR:              volAdj *= 0.25f;    return XP_SOUND_GEAR;   // that sound is too loud compared to engines, make it more quiet
        case SND_FLAPS:             volAdj *= 0.25f;    return XP_SOUND_FLAP;   // that sound is too loud compared to engines, make it more quiet
            
        default:
            LOG_MSG(logERR, "Aircraft %08X (%s): Unknown Sound Event type %d, no sound name returned",
                    modeS_id, GetFlightId().c_str(), int(sndEvent));
            return "";
    }
}